

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

color_quad_u8 __thiscall crnlib::dxt_image::get_pixel(dxt_image *this,uint x,uint y)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  undefined1 uVar5;
  uint16 packed_color;
  uint16 packed_color_00;
  long lVar6;
  byte bVar7;
  undefined1 uVar8;
  undefined2 uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  int8 iVar19;
  uint in_ECX;
  uint uVar17;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar18;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ushort packed_color5;
  undefined4 in_register_00000034;
  long lVar24;
  color_quad_u8 c1;
  color_quad_u8 c0;
  uint byte_bit_ofs;
  uint selector_index;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_a8 [4];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_98 [6];
  long local_80;
  uint local_74;
  ulong local_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  dxt_image *local_38;
  
  lVar24 = CONCAT44(in_register_00000034,x);
  *(undefined4 *)&(this->m_elements).m_p = 0xff000000;
  uVar14 = (ulong)*(uint *)(lVar24 + 0x30);
  if (*(uint *)(lVar24 + 0x30) != 0) {
    uVar22 = y >> 2;
    local_74 = in_ECX >> 2;
    uVar17 = y & 3;
    local_58 = (ulong)uVar17;
    local_64 = in_ECX & 3;
    local_70 = (ulong)local_64;
    local_5c = uVar17 + local_64 * 4;
    local_40 = (ulong)local_5c;
    local_5c = local_5c * 3;
    local_48 = (ulong)(local_5c >> 3);
    local_5c = local_5c & 7;
    local_60 = y * 2 & 6;
    local_64 = local_64 + (y & 1) * 4;
    local_50 = (ulong)(uVar17 >> 1) ^ 7;
    uVar21 = 0;
    local_80 = lVar24;
    local_38 = this;
    do {
      iVar10 = (int)uVar14;
      iVar20 = (int)uVar21;
      switch(*(undefined4 *)(lVar24 + 0x3c + uVar21 * 4)) {
      case 1:
        lVar6 = *(long *)(lVar24 + 0x10);
        uVar14 = (ulong)((*(int *)(lVar24 + 0x20) * local_74 + uVar22) * iVar10 + iVar20);
        packed_color = *(uint16 *)(lVar6 + uVar14 * 8);
        packed_color_00 = *(uint16 *)(lVar6 + 2 + uVar14 * 8);
        dxt1_block::unpack_color((dxt1_block *)&local_98[0].field_0,packed_color,true,0xff);
        dxt1_block::unpack_color((dxt1_block *)&local_a8[0].field_0,packed_color_00,true,0xff);
        bVar7 = *(byte *)(local_70 + 4 + lVar6 + uVar14 * 8) >> ((byte)local_60 & 0x1f) & 3;
        lVar24 = local_80;
        if (packed_color <= packed_color_00) {
          switch(bVar7) {
          case 0:
            goto switchD_0018b198_caseD_0;
          case 1:
            goto switchD_0018b198_caseD_1;
          case 2:
            *(char *)&(this->m_elements).m_p =
                 (char)((uint)(byte)local_a8[0]._0_1_ + (uint)(byte)local_98[0]._0_1_ >> 1);
            *(char *)((long)&(this->m_elements).m_p + 1) =
                 (char)((uint)(byte)local_a8[0]._1_1_ + (uint)(byte)local_98[0]._1_1_ >> 1);
            *(char *)((long)&(this->m_elements).m_p + 2) =
                 (char)((uint)(byte)local_a8[0]._2_1_ + (uint)(byte)local_98[0]._2_1_ >> 1);
            break;
          case 3:
            if (*(int *)(local_80 + 0x44) < 2) {
              *(undefined4 *)&(this->m_elements).m_p = 0;
            }
            else {
              *(undefined2 *)&(this->m_elements).m_p = 0;
              *(undefined1 *)((long)&(this->m_elements).m_p + 2) = 0;
            }
          }
          break;
        }
        switch(bVar7) {
        case 0:
switchD_0018b198_caseD_0:
          uVar9 = (undefined2)local_98[0].m_u32;
          uVar15 = local_98[0].field_0.b;
          break;
        case 1:
switchD_0018b198_caseD_1:
          uVar9 = (undefined2)local_a8[0].m_u32;
          uVar15 = local_a8[0].field_0.b;
          break;
        case 2:
          uVar8 = (undefined1)
                  (((uint)(byte)local_a8[0]._0_1_ + (uint)(byte)local_98[0]._0_1_ * 2) / 3);
          uVar16 = (undefined1)
                   (((uint)(byte)local_a8[0]._1_1_ + (uint)(byte)local_98[0]._1_1_ * 2) / 3);
          uVar15 = local_a8[0].field_0.b;
          uVar5 = local_98[0].field_0.b;
          goto LAB_0018b4d3;
        case 3:
          uVar8 = (undefined1)
                  (((uint)(byte)local_98[0]._0_1_ + (uint)(byte)local_a8[0]._0_1_ * 2) / 3);
          uVar16 = (undefined1)
                   (((uint)(byte)local_98[0]._1_1_ + (uint)(byte)local_a8[0]._1_1_ * 2) / 3);
          uVar15 = local_98[0].field_0.b;
          uVar5 = local_a8[0].field_0.b;
LAB_0018b4d3:
          *(undefined1 *)&(this->m_elements).m_p = uVar8;
          *(undefined1 *)((long)&(this->m_elements).m_p + 1) = uVar16;
          *(char *)((long)&(this->m_elements).m_p + 2) =
               (char)(((uint)(byte)uVar15 + (uint)(byte)uVar5 * 2) / 3);
          goto switchD_0018b11e_default;
        }
        *(undefined2 *)&(this->m_elements).m_p = uVar9;
        *(undefined1 *)((long)&(this->m_elements).m_p + 2) = uVar15;
        break;
      case 2:
        cVar2 = *(char *)(lVar24 + 0x38 + uVar21);
        uVar13 = dxt3_block::get_alpha
                           ((dxt3_block *)
                            ((ulong)((*(int *)(lVar24 + 0x20) * local_74 + uVar22) * iVar10 + iVar20
                                    ) * 8 + *(long *)(lVar24 + 0x10)),(uint)local_58,(uint)local_70,
                            true);
        this->m_element_component_index[((long)cVar2 & 0xffffffffU) - 0x38] = (int8)uVar13;
        break;
      case 3:
        uVar14 = (ulong)((*(int *)(lVar24 + 0x20) * local_74 + uVar22) * iVar10 + iVar20);
        lVar6 = *(long *)(lVar24 + 0x10);
        bVar7 = *(byte *)(local_48 + 2 + lVar6 + uVar14 * 8);
        uVar17 = (uint)bVar7;
        if ((uint)local_40 < 0xe) {
          uVar17 = (uint)CONCAT11(*(undefined1 *)(lVar6 + uVar14 * 8 + 3 + local_48),bVar7);
        }
        uVar11 = (uint)*(char *)(lVar24 + 0x38 + uVar21);
        bVar7 = *(byte *)(lVar6 + uVar14 * 8);
        bVar3 = *(byte *)(lVar6 + 1 + uVar14 * 8);
        uVar12 = (uint)bVar7;
        uVar23 = (uint)bVar3;
        uVar17 = uVar17 >> ((byte)local_5c & 0x1f) & 7;
        if (bVar7 <= bVar3) {
          switch(uVar17) {
          case 0:
            goto switchD_0018b24f_caseD_0;
          case 1:
            goto switchD_0018b24f_caseD_1;
          case 2:
            iVar10 = uVar23 + uVar12 * 4;
            break;
          case 3:
            iVar10 = uVar12 * 3 + uVar23 * 2;
            break;
          case 4:
            iVar10 = uVar23 * 3 + uVar12 * 2;
            break;
          case 5:
            iVar10 = uVar12 + uVar23 * 4;
            break;
          case 6:
            this->m_element_component_index[(ulong)uVar11 - 0x38] = '\0';
            goto switchD_0018b11e_default;
          case 7:
            this->m_element_component_index[(ulong)uVar11 - 0x38] = -1;
            goto switchD_0018b11e_default;
          }
          iVar19 = (int8)((uint)(iVar10 * 0x3334) >> 0x10);
          goto LAB_0018b585;
        }
        switch(uVar17) {
        case 0:
switchD_0018b24f_caseD_0:
          this->m_element_component_index[(ulong)uVar11 - 0x38] = bVar7;
          goto switchD_0018b11e_default;
        case 1:
switchD_0018b24f_caseD_1:
          this->m_element_component_index[(ulong)uVar11 - 0x38] = bVar3;
          goto switchD_0018b11e_default;
        case 2:
          uVar12 = uVar12 * 3;
          goto LAB_0018b57c;
        case 3:
          uVar12 = uVar12 * 5;
          goto LAB_0018b54b;
        case 4:
          iVar10 = uVar23 * 3 + uVar12 * 4;
          break;
        case 5:
          iVar10 = uVar12 * 3 + uVar23 * 4;
          break;
        case 6:
          uVar23 = uVar23 * 5;
LAB_0018b57c:
          iVar10 = uVar23 + uVar12 * 2;
          break;
        case 7:
          uVar23 = uVar23 * 3;
LAB_0018b54b:
          iVar10 = uVar12 + uVar23 * 2;
        }
        iVar19 = (int8)((uint)(iVar10 * 0x2493) >> 0x10);
LAB_0018b585:
        this->m_element_component_index[(ulong)uVar11 - 0x38] = iVar19;
        break;
      case 4:
        pbVar1 = (byte *)(*(long *)(lVar24 + 0x10) +
                         (ulong)((*(int *)(lVar24 + 0x20) * local_74 + uVar22) * iVar10 + iVar20) *
                         8);
        bVar7 = pbVar1[3];
        uVar17 = (uint)bVar7;
        uVar23 = bVar7 >> 2 & 7;
        uVar12 = (uint)*pbVar1;
        if ((bVar7 & 2) == 0) {
          etc1_block::get_abs_subblock_colors
                    ((color_quad_u8 *)&local_98[0].field_0,
                     (ushort)((uVar12 & 0xf0) << 4) | (ushort)(pbVar1[2] >> 4) | pbVar1[1] & 0xfff0,
                     (uint)(bVar7 >> 5));
          etc1_block::get_abs_subblock_colors
                    ((color_quad_u8 *)&local_a8[0].field_0,
                     (*pbVar1 & 0xf) << 8 | (ushort)(byte)(pbVar1[1] << 4) | pbVar1[2] & 0xf,uVar23)
          ;
        }
        else {
          bVar3 = pbVar1[1];
          bVar4 = pbVar1[2];
          packed_color5 =
               (ushort)((uVar12 & 0xf8) << 7) | (ushort)(bVar4 >> 3) + (bVar3 & 0xfff8) * 4;
          local_68 = uVar17;
          etc1_block::get_diff_subblock_colors
                    ((color_quad_u8 *)&local_98[0].field_0,packed_color5,(uint)(bVar7 >> 5));
          uVar17 = local_68;
          lVar24 = local_80;
          etc1_block::get_diff_subblock_colors
                    ((color_quad_u8 *)&local_a8[0].field_0,packed_color5,
                     (ushort)((uVar12 & 7) << 6) | (bVar4 & 7) + (bVar3 & 7) * 8,uVar23);
        }
        iVar10 = (int)local_70;
        if ((uVar17 & 1) == 0) {
          iVar10 = (int)local_58;
        }
        paVar18 = local_98;
        if (iVar10 == 3) {
          paVar18 = local_a8;
        }
        *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)&(local_38->m_elements).m_p
             = paVar18[*(byte *)((long)&g_etc1_to_selector_index +
                                (ulong)((uint)((pbVar1[local_50] >> (local_64 & 0x1f) & 1) != 0) +
                                       (pbVar1[local_50 - 2] >> ((byte)local_64 & 0x1f) & 1) * 2))];
        this = local_38;
      }
switchD_0018b11e_default:
      uVar21 = uVar21 + 1;
      uVar14 = (ulong)*(uint *)(lVar24 + 0x30);
    } while (uVar21 < uVar14);
  }
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 dxt_image::get_pixel(uint x, uint y) const
    {
        CRNLIB_ASSERT((x < m_width) && (y < m_height));

        const uint block_x = x >> cDXTBlockShift;
        const uint block_y = y >> cDXTBlockShift;

        const element* pElement = reinterpret_cast<const element*>(&get_element(block_x, block_y, 0));

        color_quad_u8 result(0, 0, 0, 255);

        for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
        {
            switch (m_element_type[element_index])
            {
            case cColorETC1:
            {
                const etc1_block& block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));

                const bool diff_flag = block.get_diff_bit();
                const bool flip_flag = block.get_flip_bit();
                const uint table_index0 = block.get_inten_table(0);
                const uint table_index1 = block.get_inten_table(1);
                color_quad_u8 subblock_colors0[4], subblock_colors1[4];

                if (diff_flag)
                {
                    const uint16 base_color5 = block.get_base5_color();
                    const uint16 delta_color3 = block.get_delta3_color();
                    etc1_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);
                    etc1_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1);
                }
                else
                {
                    const uint16 base_color4_0 = block.get_base4_color(0);
                    etc1_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);
                    const uint16 base_color4_1 = block.get_base4_color(1);
                    etc1_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
                }

                const uint bx = x & 3;
                const uint by = y & 3;

                const uint selector_index = block.get_selector(bx, by);
                if (flip_flag)
                {
                    if (by <= 2)
                    {
                        result = subblock_colors0[selector_index];
                    }
                    else
                    {
                        result = subblock_colors1[selector_index];
                    }
                }
                else
                {
                    if (bx > 2)
                    {
                        result = subblock_colors1[selector_index];
                    }
                    else
                    {
                        result = subblock_colors0[selector_index];
                    }
                }

                break;
            }
            case cColorDXT1:
            {
                const dxt1_block* pBlock = reinterpret_cast<const dxt1_block*>(&get_element(block_x, block_y, element_index));

                const uint l = pBlock->get_low_color();
                const uint h = pBlock->get_high_color();

                color_quad_u8 c0(dxt1_block::unpack_color(static_cast<uint16>(l), true));
                color_quad_u8 c1(dxt1_block::unpack_color(static_cast<uint16>(h), true));

                const uint s = pBlock->get_selector(x & 3, y & 3);

                if (l > h)
                {
                    switch (s)
                    {
                    case 0:
                        result.set_noclamp_rgb(c0.r, c0.g, c0.b);
                        break;
                    case 1:
                        result.set_noclamp_rgb(c1.r, c1.g, c1.b);
                        break;
                    case 2:
                        result.set_noclamp_rgb((c0.r * 2 + c1.r) / 3, (c0.g * 2 + c1.g) / 3, (c0.b * 2 + c1.b) / 3);
                        break;
                    case 3:
                        result.set_noclamp_rgb((c1.r * 2 + c0.r) / 3, (c1.g * 2 + c0.g) / 3, (c1.b * 2 + c0.b) / 3);
                        break;
                    }
                }
                else
                {
                    switch (s)
                    {
                    case 0:
                        result.set_noclamp_rgb(c0.r, c0.g, c0.b);
                        break;
                    case 1:
                        result.set_noclamp_rgb(c1.r, c1.g, c1.b);
                        break;
                    case 2:
                        result.set_noclamp_rgb((c0.r + c1.r) >> 1U, (c0.g + c1.g) >> 1U, (c0.b + c1.b) >> 1U);
                        break;
                    case 3:
                    {
                        if (m_format <= cDXT1A)
                        {
                            result.set_noclamp_rgba(0, 0, 0, 0);
                        }
                        else
                        {
                            result.set_noclamp_rgb(0, 0, 0);
                        }
                        break;
                    }
                    }
                }

                break;
            }
            case cAlphaDXT5:
            {
                const int comp_index = m_element_component_index[element_index];

                const dxt5_block* pBlock = reinterpret_cast<const dxt5_block*>(&get_element(block_x, block_y, element_index));

                const uint l = pBlock->get_low_alpha();
                const uint h = pBlock->get_high_alpha();

                const uint s = pBlock->get_selector(x & 3, y & 3);

                if (l > h)
                {
                    switch (s)
                    {
                    case 0:
                        result[comp_index] = static_cast<uint8>(l);
                        break;
                    case 1:
                        result[comp_index] = static_cast<uint8>(h);
                        break;
                    case 2:
                        result[comp_index] = static_cast<uint8>((l * 6 + h) / 7);
                        break;
                    case 3:
                        result[comp_index] = static_cast<uint8>((l * 5 + h * 2) / 7);
                        break;
                    case 4:
                        result[comp_index] = static_cast<uint8>((l * 4 + h * 3) / 7);
                        break;
                    case 5:
                        result[comp_index] = static_cast<uint8>((l * 3 + h * 4) / 7);
                        break;
                    case 6:
                        result[comp_index] = static_cast<uint8>((l * 2 + h * 5) / 7);
                        break;
                    case 7:
                        result[comp_index] = static_cast<uint8>((l + h * 6) / 7);
                        break;
                    }
                }
                else
                {
                    switch (s)
                    {
                    case 0:
                        result[comp_index] = static_cast<uint8>(l);
                        break;
                    case 1:
                        result[comp_index] = static_cast<uint8>(h);
                        break;
                    case 2:
                        result[comp_index] = static_cast<uint8>((l * 4 + h) / 5);
                        break;
                    case 3:
                        result[comp_index] = static_cast<uint8>((l * 3 + h * 2) / 5);
                        break;
                    case 4:
                        result[comp_index] = static_cast<uint8>((l * 2 + h * 3) / 5);
                        break;
                    case 5:
                        result[comp_index] = static_cast<uint8>((l + h * 4) / 5);
                        break;
                    case 6:
                        result[comp_index] = 0;
                        break;
                    case 7:
                        result[comp_index] = 255;
                        break;
                    }
                }

                break;
            }
            case cAlphaDXT3:
            {
                const int comp_index = m_element_component_index[element_index];

                const dxt3_block* pBlock = reinterpret_cast<const dxt3_block*>(&get_element(block_x, block_y, element_index));

                result[comp_index] = static_cast<uint8>(pBlock->get_alpha(x & 3, y & 3, true));

                break;
            }
            default:
                break;
            }
        }

        return result;
    }